

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

shared_ptr<tonk::gateway::MappedPortLifetime>
tonk::gateway::RequestPortMap(uint16_t localPort,char *interfaceAddress)

{
  bool bVar1;
  void *pvVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint16_t in_SI;
  GatewayPortMapper *in_RDI;
  shared_ptr<tonk::gateway::MappedPortLifetime> sVar4;
  AppRequest request;
  shared_ptr<tonk::gateway::MappedPortLifetime> ref;
  Result result;
  lock_guard<std::mutex> locker;
  LogStringBuffer buffer;
  mutex_type *in_stack_fffffffffffffc38;
  LogStringBuffer *in_stack_fffffffffffffc40;
  Result *in_stack_fffffffffffffc68;
  LogStringBuffer *in_stack_fffffffffffffc78;
  LogStringBuffer *pLVar5;
  OutputWorker *in_stack_fffffffffffffc80;
  void *local_368;
  GatewayPortMapper *this;
  AppRequest local_350;
  undefined1 local_340 [110];
  uint16_t local_2d2;
  undefined1 *local_2c8;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  string *local_80;
  char *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  LogStringBuffer *local_28;
  string *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  this = in_RDI;
  local_2d2 = in_SI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (API_References < 1) {
    Delete_PortMapper();
    pvVar2 = operator_new(0x18,(nothrow_t *)&std::nothrow);
    local_340[0x3f] = 0;
    local_368 = (void *)0x0;
    if (pvVar2 != (void *)0x0) {
      local_340[0x3f] = 1;
      local_340._64_8_ = pvVar2;
      GatewayPortMapper::GatewayPortMapper((GatewayPortMapper *)in_stack_fffffffffffffc40);
      local_368 = pvVar2;
    }
    m_PortMapper = local_368;
    if (local_368 == (void *)0x0) {
      std::shared_ptr<tonk::gateway::MappedPortLifetime>::shared_ptr
                ((shared_ptr<tonk::gateway::MappedPortLifetime> *)in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38);
      local_340._56_4_ = 1;
      goto LAB_002072c2;
    }
    GatewayPortMapper::Initialize(this,(char *)in_RDI);
    local_2c8 = local_340 + 0x30;
    if (local_340._48_8_ == 0) {
      local_340._56_4_ = 0;
    }
    else {
      Result::ToJson_abi_cxx11_(in_stack_fffffffffffffc68);
      local_2b0 = &ModuleLogger;
      local_2b8 = "Unable to initialize port mapper: ";
      local_2c0 = (string *)(local_340 + 0x10);
      local_290 = &ModuleLogger;
      local_294 = 4;
      local_2a0 = "Unable to initialize port mapper: ";
      in_stack_fffffffffffffc80 = (OutputWorker *)&ModuleLogger;
      local_280 = &ModuleLogger;
      local_284 = 4;
      local_2a8 = local_2c0;
      if (DAT_00329338 < 5) {
        local_c8 = &ModuleLogger;
        local_cc = 4;
        local_d8 = "Unable to initialize port mapper: ";
        pLVar5 = (LogStringBuffer *)&ModuleLogger;
        local_e0 = local_2c0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,Trace);
        local_b0 = &pLVar5->field_0x38;
        local_a8 = local_268;
        local_b8 = local_d8;
        local_c0 = local_e0;
        in_stack_fffffffffffffc78 = pLVar5;
        local_a0 = pLVar5;
        local_98 = local_b0;
        local_90 = local_a8;
        local_88 = pLVar5;
        local_60 = local_b0;
        local_58 = local_a8;
        std::operator<<(aoStack_258,(string *)local_b0);
        local_70 = local_a8;
        local_78 = local_b8;
        local_80 = local_c0;
        local_48 = local_a8;
        local_50 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        local_68 = pLVar5;
        local_40 = pLVar5;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_30 = local_70;
        local_38 = local_80;
        local_18 = local_70;
        local_20 = local_80;
        local_28 = pLVar5;
        std::operator<<((ostream *)(local_70 + 0x10),local_80);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x2070e8);
      }
      std::__cxx11::string::~string((string *)(local_340 + 0x10));
      Delete_PortMapper();
      std::shared_ptr<tonk::gateway::MappedPortLifetime>::shared_ptr
                ((shared_ptr<tonk::gateway::MappedPortLifetime> *)in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38);
      local_340._56_4_ = 1;
    }
    Result::~Result((Result *)in_stack_fffffffffffffc40);
    if (local_340._56_4_ != 0) goto LAB_002072c2;
  }
  MakeSharedNoThrow<tonk::gateway::MappedPortLifetime>();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_340);
  if (bVar1) {
    if (m_PortMapper != (void *)0x0) {
      AppRequest::AppRequest(&local_350);
      local_350.LocalPort = local_2d2;
      local_350.Type = Add;
      in_stack_fffffffffffffc40 = (LogStringBuffer *)local_340;
      local_350.API_LifetimePtr =
           std::__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2> *
                      )in_stack_fffffffffffffc40);
      peVar3 = std::
               __shared_ptr_access<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x20723b);
      (peVar3->Request).LocalPort = local_350.LocalPort;
      *(undefined2 *)&(peVar3->Request).field_0x2 = local_350._2_2_;
      (peVar3->Request).Type = local_350.Type;
      (peVar3->Request).API_LifetimePtr = local_350.API_LifetimePtr;
      std::
      unique_ptr<tonk::gateway::StateMachine,_std::default_delete<tonk::gateway::StateMachine>_>::
      operator->((unique_ptr<tonk::gateway::StateMachine,_std::default_delete<tonk::gateway::StateMachine>_>
                  *)0x207255);
      StateMachine::API_Request
                ((StateMachine *)in_stack_fffffffffffffc80,(AppRequest *)in_stack_fffffffffffffc78);
    }
    API_References = API_References + 1;
    std::shared_ptr<tonk::gateway::MappedPortLifetime>::shared_ptr
              ((shared_ptr<tonk::gateway::MappedPortLifetime> *)in_stack_fffffffffffffc40,
               (shared_ptr<tonk::gateway::MappedPortLifetime> *)in_stack_fffffffffffffc38);
  }
  else {
    std::shared_ptr<tonk::gateway::MappedPortLifetime>::shared_ptr
              ((shared_ptr<tonk::gateway::MappedPortLifetime> *)in_stack_fffffffffffffc40,
               in_stack_fffffffffffffc38);
  }
  local_340._56_4_ = 1;
  std::shared_ptr<tonk::gateway::MappedPortLifetime>::~shared_ptr
            ((shared_ptr<tonk::gateway::MappedPortLifetime> *)0x2072c2);
LAB_002072c2:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2072cf);
  sVar4.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tonk::gateway::MappedPortLifetime>)
         sVar4.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MappedPortLifetime> RequestPortMap(
    uint16_t localPort,
    const char* interfaceAddress)
{
    std::lock_guard<std::mutex> locker(APILock);

    // If initialization is needed:
    TONK_DEBUG_ASSERT(API_References >= 0);
    if (API_References <= 0)
    {
        TONK_DEBUG_ASSERT(m_PortMapper == nullptr);
        Delete_PortMapper();

        // Allocate port mapper
        m_PortMapper = new(std::nothrow) GatewayPortMapper;
        if (!m_PortMapper) {
            return nullptr; // OOM
        }

        // Initialize background thread and Asio objects
        Result result = m_PortMapper->Initialize(interfaceAddress);
        if (result.IsFail())
        {
            ModuleLogger.Error("Unable to initialize port mapper: ", result.ToJson());
            Delete_PortMapper();
            return nullptr;
        }
    }

    // Create a request lifetime object
    std::shared_ptr<MappedPortLifetime> ref = MakeSharedNoThrow<MappedPortLifetime>();
    if (!ref) {
        return nullptr; // OOM
    }

    // Put in request
    TONK_DEBUG_ASSERT(m_PortMapper);
    if (m_PortMapper)
    {
        AppRequest request;
        request.LocalPort = localPort;
        request.Type = RequestType::Add;
        request.API_LifetimePtr = ref.get();

        ref->Request = request;

        // Insert request
        m_PortMapper->State->API_Request(request);
    }

    // Increment references to API
    ++API_References;

    return ref;
}